

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

DiagnosticStream * __thiscall
anon_unknown.dwarf_15d176c::Parser::diagnostic
          (DiagnosticStream *__return_storage_ptr__,Parser *this,spv_result_t error)

{
  MessageConsumer *consumer;
  spv_position_t position;
  allocator<char> local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  size_t local_48;
  string local_40;
  
  local_58 = 0;
  uStack_50 = 0;
  local_48 = (this->_).instruction_count;
  consumer = this->consumer_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_59);
  position.column = uStack_50;
  position.line = local_58;
  position.index = local_48;
  spvtools::DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,consumer,&local_40,error);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

spvtools::DiagnosticStream diagnostic(spv_result_t error) {
    return spvtools::DiagnosticStream({0, 0, _.instruction_count}, consumer_,
                                      "", error);
  }